

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,UnicodeString *varTop,UErrorCode *errorCode)

{
  uint uVar1;
  uint32_t uVar2;
  char16_t *pcVar3;
  UErrorCode *errorCode_local;
  UnicodeString *varTop_local;
  RuleBasedCollator *this_local;
  
  pcVar3 = UnicodeString::getBuffer(varTop);
  uVar1 = UnicodeString::length(varTop);
  uVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x1b])
                    (this,pcVar3,(ulong)uVar1,errorCode);
  return uVar2;
}

Assistant:

uint32_t
RuleBasedCollator::setVariableTop(const UnicodeString &varTop, UErrorCode &errorCode) {
    return setVariableTop(varTop.getBuffer(), varTop.length(), errorCode);
}